

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SiameseEncoder.cpp
# Opt level: O0

void __thiscall siamese::EncoderPacketWindow::StartNewWindow(EncoderPacketWindow *this,uint column)

{
  uint uVar1;
  uint in_ESI;
  long in_RDI;
  uint laneIndex;
  uint element;
  LogStringBuffer buffer;
  char *in_stack_fffffffffffffce8;
  LogStringBuffer *in_stack_fffffffffffffcf0;
  undefined4 in_stack_fffffffffffffd28;
  uint uVar2;
  undefined1 local_268 [16];
  ostream aoStack_258 [376];
  uint *local_e0;
  char *local_d8;
  undefined4 local_cc;
  undefined8 *local_c8;
  uint *local_c0;
  char *local_b8;
  undefined *local_b0;
  undefined1 *local_a8;
  undefined8 *local_a0;
  undefined *local_98;
  undefined1 *local_90;
  undefined8 *local_88;
  undefined *local_80;
  undefined1 *local_78;
  uint *local_70;
  char *local_68;
  undefined1 *local_60;
  undefined8 *local_58;
  char *local_50;
  undefined1 *local_48;
  undefined8 *local_40;
  uint *local_38;
  undefined1 *local_30;
  undefined8 *local_28;
  char *local_20;
  undefined1 *local_18;
  uint *local_10;
  undefined1 *local_8;
  
  uVar1 = in_ESI & 7;
  *(uint *)(in_RDI + 0x18) = in_ESI - uVar1;
  *(uint *)(in_RDI + 0x24) = uVar1;
  *(uint *)(in_RDI + 0x28) = uVar1;
  *(uint *)(in_RDI + 0x20) = uVar1;
  *(uint *)(in_RDI + 0x14) = uVar1 + 1;
  *(undefined4 *)(in_RDI + 0x1c) = 0;
  for (uVar2 = 0; uVar2 < 8; uVar2 = uVar2 + 1) {
    *(undefined4 *)(in_RDI + (ulong)uVar2 * 0x48 + 0x158) = 0;
  }
  local_e0 = (uint *)(in_RDI + 0x18);
  if (DAT_002b6400 < 3) {
    local_c8 = &Logger;
    local_cc = 2;
    local_d8 = ">>> Starting a new window from column ";
    logger::LogStringBuffer::LogStringBuffer
              (in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8,Trace);
    local_b0 = &DAT_002b6430;
    local_a0 = &Logger;
    local_b8 = local_d8;
    local_c0 = local_e0;
    local_88 = &Logger;
    local_a8 = local_268;
    local_98 = local_b0;
    local_90 = local_268;
    local_80 = local_b0;
    local_78 = local_268;
    std::operator<<(aoStack_258,(string *)&DAT_002b6430);
    local_58 = &Logger;
    local_60 = local_a8;
    local_68 = local_b8;
    local_70 = local_c0;
    local_40 = &Logger;
    local_48 = local_a8;
    local_50 = local_b8;
    local_18 = local_a8;
    local_20 = local_b8;
    std::operator<<((ostream *)(local_a8 + 0x10),local_b8);
    local_28 = &Logger;
    local_30 = local_60;
    local_38 = local_70;
    local_8 = local_60;
    local_10 = local_70;
    std::ostream::operator<<((ostream *)(local_60 + 0x10),*local_70);
    logger::OutputWorker::GetInstance();
    logger::OutputWorker::Write
              ((OutputWorker *)CONCAT44(in_ESI,uVar1),
               (LogStringBuffer *)CONCAT44(uVar2,in_stack_fffffffffffffd28));
    logger::LogStringBuffer::~LogStringBuffer((LogStringBuffer *)0x1d56e8);
  }
  return;
}

Assistant:

void EncoderPacketWindow::StartNewWindow(unsigned column)
{
    // Maintain the invariant that element % 8 == column % 8 by skipping some
    const unsigned element = column % kColumnLaneCount;
    ColumnStart            = column - element;
    SIAMESE_DEBUG_ASSERT(column >= element && ColumnStart < kColumnPeriod);
    SumStartElement        = element;
    SumEndElement          = element;
    FirstUnremovedElement  = element;
    Count                  = element + 1;

    // Reset longest packet
    LongestPacket = 0;
    for (unsigned laneIndex = 0; laneIndex < kColumnLaneCount; ++laneIndex) {
        Lanes[laneIndex].LongestPacket = 0;
    }

    Logger.Info(">>> Starting a new window from column ", ColumnStart);
}